

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void mi_printf_amount(int64_t n,int64_t unit,mi_output_fun *out,void *arg,char *fmt)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char buf [32];
  char unitdesc [8];
  char local_58 [40];
  char local_30 [8];
  
  local_58[0] = '\0';
  pcVar8 = "B";
  if (unit < 1) {
    pcVar8 = " ";
  }
  uVar4 = 0x400;
  if (unit == 0) {
    uVar4 = 1000;
  }
  uVar3 = -n;
  if (0 < n) {
    uVar3 = n;
  }
  if (uVar3 < uVar4) {
    if ((n != 1) || (*pcVar8 != 'B')) {
      if (n == 0) {
        pcVar8 = "";
      }
      _mi_snprintf(local_58,0x20,"%lld   %-3s",n,pcVar8);
    }
  }
  else {
    uVar6 = 0x100000;
    if (unit == 0) {
      uVar6 = 1000000;
    }
    pcVar8 = "i";
    if (unit == 0) {
      pcVar8 = "";
    }
    pcVar9 = "M";
    if (uVar3 < uVar6) {
      pcVar9 = "K";
      uVar6 = uVar4;
    }
    uVar5 = uVar4 * uVar6;
    pcVar1 = "G";
    if (uVar3 < uVar4 * uVar6) {
      uVar5 = uVar6;
      pcVar1 = pcVar9;
    }
    lVar2 = n / (long)(uVar5 / 10);
    lVar10 = lVar2 % 10;
    _mi_snprintf(local_30,8,"%s%s%s",pcVar1,pcVar8);
    lVar7 = -lVar10;
    if (0 < lVar10) {
      lVar7 = lVar10;
    }
    _mi_snprintf(local_58,0x20,"%ld.%ld %-3s",lVar2 / 10,lVar7,local_30);
  }
  pcVar8 = "%12s";
  if (arg != (void *)0x0) {
    pcVar8 = (char *)arg;
  }
  _mi_fprintf(mi_buffered_out,out,pcVar8,local_58);
  return;
}

Assistant:

static void mi_printf_amount(int64_t n, int64_t unit, mi_output_fun* out, void* arg, const char* fmt) {
  char buf[32]; buf[0] = 0;
  int  len = 32;
  const char* suffix = (unit <= 0 ? " " : "B");
  const int64_t base = (unit == 0 ? 1000 : 1024);
  if (unit>0) n *= unit;

  const int64_t pos = (n < 0 ? -n : n);
  if (pos < base) {
    if (n!=1 || suffix[0] != 'B') {  // skip printing 1 B for the unit column
      _mi_snprintf(buf, len, "%lld   %-3s", (long long)n, (n==0 ? "" : suffix));
    }
  }
  else {
    int64_t divider = base;
    const char* magnitude = "K";
    if (pos >= divider*base) { divider *= base; magnitude = "M"; }
    if (pos >= divider*base) { divider *= base; magnitude = "G"; }
    const int64_t tens = (n / (divider/10));
    const long whole = (long)(tens/10);
    const long frac1 = (long)(tens%10);
    char unitdesc[8];
    _mi_snprintf(unitdesc, 8, "%s%s%s", magnitude, (base==1024 ? "i" : ""), suffix);
    _mi_snprintf(buf, len, "%ld.%ld %-3s", whole, (frac1 < 0 ? -frac1 : frac1), unitdesc);
  }
  _mi_fprintf(out, arg, (fmt==NULL ? "%12s" : fmt), buf);
}